

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O2

string * __thiscall
jbcoin::STArray::getText_abi_cxx11_(string *__return_storage_ptr__,STArray *this)

{
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  string asStack_48 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",(allocator *)asStack_48);
  pSVar1 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pSVar3 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    if (!bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*(pSVar3->super_STBase)._vptr_STBase[6])(asStack_48,pSVar3);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(asStack_48);
    bVar2 = false;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string STArray::getText () const
{
    std::string r = "[";

    bool first = true;
    for (STObject const& o : v_)
    {
        if (!first)
            r += ",";

        r += o.getText ();
        first = false;
    }

    r += "]";
    return r;
}